

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phix_manager.c
# Opt level: O3

int write_phixfaix(int coff,int compno,opj_codestream_info_t cstr_info,opj_bool EPHused,int j2klen,
                  opj_cio_t *cio)

{
  long *plVar1;
  int pos;
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  ulong v;
  long lVar28;
  ulong local_178;
  long local_158;
  long local_150;
  long local_148;
  long local_140;
  undefined8 local_118;
  ulong uStack_110;
  
  pos = cio_tell(cio);
  cio_skip(cio,4);
  cio_write(cio,0x66616978,4);
  iVar26 = 0;
  cio_write(cio,0,1);
  lVar6 = (long)compno;
  if (-1 < cstr_info.numdecompos[lVar6]) {
    lVar17 = 0;
    iVar26 = 0;
    do {
      iVar26 = iVar26 + (cstr_info.tile)->pw[lVar17] * (cstr_info.tile)->ph[lVar17] *
                        cstr_info.numlayers;
      lVar17 = lVar17 + 1;
    } while ((ulong)(uint)cstr_info.numdecompos[lVar6] + 1 != lVar17);
  }
  cio_write(cio,(long)iVar26,4);
  v = (long)cstr_info.th * (long)cstr_info.tw;
  cio_write(cio,v,4);
  if (0 < (int)v) {
    lVar7 = (long)cstr_info.numcomps;
    lVar10 = (long)cstr_info.numlayers;
    lVar17 = lVar10 * 0x20;
    lVar3 = lVar7 * lVar10 * 0x20;
    lVar8 = lVar7 * 0x20;
    local_118._0_4_ = 0xffffffff;
    local_118._4_4_ = 0xffffffff;
    local_178 = 0;
    uVar2 = 0xffffffff;
    do {
      uStack_110 = (ulong)uVar2;
      if (cstr_info.numdecompos[lVar6] < 0) {
        iVar20 = 0;
        uStack_110._0_4_ = uVar2;
      }
      else {
        lVar18 = (ulong)(uint)cstr_info.numdecompos[lVar6] + 1;
        lVar4 = (long)(int)lVar18;
        local_140 = lVar10 * lVar6 * 0x20 * lVar4;
        local_148 = 0;
        lVar22 = 0;
        iVar20 = 0;
        local_158 = lVar6 << 5;
        local_150 = lVar6 << 5;
        do {
          uVar2 = cstr_info.tile[local_178].ph[lVar22] * cstr_info.tile[local_178].pw[lVar22];
          if (0 < (int)uVar2) {
            uVar23 = (ulong)uVar2;
            lVar24 = (local_148 * uVar23 + lVar6) * lVar17;
            lVar9 = ((int)(compno * uVar2) * lVar4 + lVar22) * lVar17;
            lVar13 = local_158 * uVar23;
            lVar5 = local_150 * uVar23;
            uVar11 = 0;
            lVar16 = local_140;
            do {
              lVar15 = lVar16;
              lVar19 = lVar5;
              lVar21 = lVar13;
              lVar25 = lVar9;
              uVar14 = (ulong)(uint)cstr_info.numlayers;
              lVar27 = lVar24;
              if (0 < cstr_info.numlayers) {
                do {
                  switch(cstr_info.prog) {
                  case LRCP:
                    plVar1 = (long *)((long)&(cstr_info.tile[local_178].packet)->start_pos + lVar19)
                    ;
                    lVar28 = *plVar1;
                    uStack_110 = plVar1[1];
                    break;
                  case RLCP:
                    plVar1 = (long *)((long)&(cstr_info.tile[local_178].packet)->start_pos + lVar21)
                    ;
                    lVar28 = *plVar1;
                    uStack_110 = plVar1[1];
                    break;
                  case RPCL:
                    plVar1 = (long *)((long)&(cstr_info.tile[local_178].packet)->start_pos + lVar27)
                    ;
                    lVar28 = *plVar1;
                    uStack_110 = plVar1[1];
                    break;
                  case PCRL:
                    plVar1 = (long *)((long)&(cstr_info.tile[local_178].packet)->start_pos + lVar15)
                    ;
                    lVar28 = *plVar1;
                    uStack_110 = plVar1[1];
                    break;
                  case CPRL:
                    plVar1 = (long *)((long)&(cstr_info.tile[local_178].packet)->start_pos + lVar25)
                    ;
                    lVar28 = *plVar1;
                    uStack_110 = plVar1[1];
                    break;
                  default:
                    write_phixfaix_cold_1();
                    lVar28 = local_118;
                  }
                  cio_write(cio,lVar28 - coff,4);
                  local_118._4_4_ = (undefined4)((ulong)lVar28 >> 0x20);
                  cio_write(cio,(CONCAT44(local_118._4_4_,(uint)uStack_110) - lVar28) + 1,4);
                  uVar14 = uVar14 - 1;
                  lVar15 = lVar15 + 0x20;
                  lVar19 = lVar19 + lVar8 * lVar4 * uVar23;
                  lVar21 = lVar21 + lVar8 * uVar23;
                  lVar25 = lVar25 + 0x20;
                  lVar27 = lVar27 + 0x20;
                  local_118 = lVar28;
                } while (uVar14 != 0);
                iVar20 = iVar20 + cstr_info.numlayers;
              }
              uVar11 = uVar11 + 1;
              lVar24 = lVar24 + lVar3;
              lVar16 = lVar16 + lVar3 * lVar4;
              lVar9 = lVar9 + lVar17 * lVar4;
              lVar13 = lVar13 + 0x20;
              lVar5 = lVar5 + 0x20;
            } while (uVar11 != uVar23);
          }
          lVar22 = lVar22 + 1;
          local_148 = local_148 + lVar7;
          local_140 = local_140 + lVar17;
          local_158 = local_158 + lVar3;
          local_150 = local_150 + lVar8;
        } while (lVar22 != lVar18);
      }
      iVar12 = iVar26 - iVar20;
      if (iVar12 != 0 && iVar20 <= iVar26) {
        do {
          cio_write(cio,0,4);
          cio_write(cio,0,4);
          iVar12 = iVar12 + -1;
        } while (iVar12 != 0);
      }
      local_178 = local_178 + 1;
      uVar2 = (uint)uStack_110;
    } while (local_178 != (v & 0xffffffff));
  }
  iVar26 = cio_tell(cio);
  cio_seek(cio,pos);
  cio_write(cio,(long)(iVar26 - pos),4);
  cio_seek(cio,iVar26);
  return iVar26 - pos;
}

Assistant:

int write_phixfaix( int coff, int compno, opj_codestream_info_t cstr_info, opj_bool EPHused, int j2klen, opj_cio_t *cio)
{
  int len, lenp, tileno, version, i, nmax, size_of_coding; /* 4 or 8 */
  opj_tile_info_t *tile_Idx;
  opj_packet_info_t packet;
  int resno, precno, layno, num_packet;
  int numOfres, numOfprec, numOflayers;
  packet.end_ph_pos = packet.start_pos = -1;
  (void)EPHused; /* unused ? */

  if( j2klen > pow( 2, 32)){
    size_of_coding =  8;
    version = 1;
  }
  else{
    size_of_coding = 4;
    version = 0;
  }

  lenp = cio_tell( cio);
  cio_skip( cio, 4);              /* L [at the end]      */
  cio_write( cio, JPIP_FAIX, 4);  /* FAIX                */ 
  cio_write( cio, version,1);     /* Version 0 = 4 bytes */

  nmax = 0;
  for( i=0; i<=cstr_info.numdecompos[compno]; i++)
    nmax += cstr_info.tile[0].ph[i] * cstr_info.tile[0].pw[i] * cstr_info.numlayers;
  
  cio_write( cio, nmax, size_of_coding); /* NMAX */
  cio_write( cio, cstr_info.tw*cstr_info.th, size_of_coding);      /* M    */
  
  for( tileno=0; tileno<cstr_info.tw*cstr_info.th; tileno++){
    tile_Idx = &cstr_info.tile[ tileno];
    
    num_packet = 0;
    numOfres = cstr_info.numdecompos[compno] + 1;

    for( resno=0; resno<numOfres ; resno++){
      numOfprec = tile_Idx->pw[resno]*tile_Idx->ph[resno];
      for( precno=0; precno<numOfprec; precno++){
	numOflayers = cstr_info.numlayers;
	for( layno=0; layno<numOflayers; layno++){
	  
	  switch ( cstr_info.prog){
	  case LRCP:
	    packet = tile_Idx->packet[ ((layno*numOfres+resno)*cstr_info.numcomps+compno)*numOfprec+precno];
	    break;
	  case RLCP:
	    packet = tile_Idx->packet[ ((resno*numOflayers+layno)*cstr_info.numcomps+compno)*numOfprec+precno];
	    break;
	  case RPCL:
	    packet = tile_Idx->packet[ ((resno*numOfprec+precno)*cstr_info.numcomps+compno)*numOflayers+layno];
	    break;
	  case PCRL:
	    packet = tile_Idx->packet[ ((precno*cstr_info.numcomps+compno)*numOfres+resno)*numOflayers + layno];
	    break;
	  case CPRL:
	    packet = tile_Idx->packet[ ((compno*numOfprec+precno)*numOfres+resno)*numOflayers + layno];
	    break;
	  default:
	    fprintf( stderr, "failed to ppix indexing\n");
	  }

	  cio_write( cio, packet.start_pos-coff, size_of_coding);                /* start position */
	  cio_write( cio, packet.end_ph_pos-packet.start_pos+1, size_of_coding); /* length         */
	  
	  num_packet++;
	}
      }
    }

    /* PADDING */
    while( num_packet < nmax){
      cio_write( cio, 0, size_of_coding); /* start position            */
      cio_write( cio, 0, size_of_coding); /* length                    */
      num_packet++;
    }
  }

  len = cio_tell( cio)-lenp;
  cio_seek( cio, lenp);
  cio_write( cio, len, 4);        /* L  */
  cio_seek( cio, lenp+len);

  return len;
}